

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O2

bool Assimp::PLY::Element::ParseElement
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               Element *pOut)

{
  char *pcVar1;
  bool bVar2;
  EElementSemantic EVar3;
  uint uVar4;
  size_t sVar5;
  Property prop;
  char *pCur;
  
  if (pOut == (Element *)0x0) {
    __assert_fail("__null != pOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyParser.cpp"
                  ,0x15e,
                  "static bool Assimp::PLY::Element::ParseElement(IOStreamBuffer<char> &, std::vector<char> &, PLY::Element *)"
                 );
  }
  bVar2 = DOM::SkipSpaces(buffer);
  if ((bVar2) &&
     (((bVar2 = DOM::TokenMatch(buffer,"element",7), bVar2 ||
       (bVar2 = DOM::TokenMatch(buffer,"comment",7), bVar2)) &&
      (bVar2 = DOM::SkipSpaces(buffer), bVar2)))) {
    EVar3 = ParseSemantic(buffer);
    pOut->eSemantic = EVar3;
    if (EVar3 == EEST_INVALID) {
      pcVar1 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = strlen(pcVar1);
      prop._0_8_ = &prop.szName._M_string_length;
      std::__cxx11::string::_M_construct<char*>((string *)&prop,pcVar1,pcVar1 + sVar5);
      std::__cxx11::string::operator=((string *)&pOut->szName,(string *)&prop);
      std::__cxx11::string::~string((string *)&prop);
    }
    bVar2 = DOM::SkipSpaces(buffer);
    if (bVar2) {
      if (pOut->eSemantic == EEST_TextureFile) {
        pcVar1 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        sVar5 = strlen(pcVar1);
        prop._0_8_ = &prop.szName._M_string_length;
        std::__cxx11::string::_M_construct<char*>((string *)&prop,pcVar1,pcVar1 + (sVar5 - 1));
        std::__cxx11::string::operator=((string *)&pOut->szName,(string *)&prop);
        std::__cxx11::string::~string((string *)&prop);
        DOM::SkipSpacesAndLineEnd(buffer);
      }
      else {
        pCur = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
        uVar4 = strtoul10(pCur,&pCur);
        pOut->NumOccur = uVar4;
        DOM::SkipSpacesAndLineEnd(buffer);
        while( true ) {
          IOStreamBuffer<char>::getNextLine(streamBuffer,buffer);
          pCur = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
          DOM::SkipComments(buffer);
          prop.eType = EDT_Int;
          prop.Semantic = EST_XCoord;
          prop.szName._M_string_length = 0;
          prop.szName.field_2._M_local_buf[0] = '\0';
          prop.bIsList = false;
          prop.eFirstType = EDT_UChar;
          prop.szName._M_dataplus._M_p = (pointer)&prop.szName.field_2;
          bVar2 = Property::ParseProperty(buffer,&prop);
          if (!bVar2) break;
          std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::push_back
                    (&pOut->alProperties,&prop);
          std::__cxx11::string::~string((string *)&prop.szName);
        }
        std::__cxx11::string::~string((string *)&prop.szName);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool PLY::Element::ParseElement(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer, PLY::Element* pOut)
{
  ai_assert(NULL != pOut);
  // Example format: "element vertex 8"

  // skip leading spaces
  if (!PLY::DOM::SkipSpaces(buffer))
  {
    return false;
  }

  // skip the "element" string at the beginning
  if (!PLY::DOM::TokenMatch(buffer, "element", 7) && !PLY::DOM::TokenMatch(buffer, "comment", 7))
  {
    // seems not to be a valid property entry
    return false;
  }
  // get next word
  if (!PLY::DOM::SkipSpaces(buffer))
    return false;

  // parse the semantic of the element
  pOut->eSemantic = PLY::Element::ParseSemantic(buffer);
  if (PLY::EEST_INVALID == pOut->eSemantic)
  {
    // if the exact semantic can't be determined, just store
    // the original string identifier
    pOut->szName = std::string(&buffer[0], &buffer[0] + strlen(&buffer[0]));
  }

  if (!PLY::DOM::SkipSpaces(buffer))
    return false;

  if (PLY::EEST_TextureFile == pOut->eSemantic)
  {
    char* endPos = &buffer[0] + (strlen(&buffer[0]) - 1);
    pOut->szName = std::string(&buffer[0], endPos);

    // go to the next line
    PLY::DOM::SkipSpacesAndLineEnd(buffer);

    return true;
  }

  //parse the number of occurrences of this element
  const char* pCur = (char*)&buffer[0];
  pOut->NumOccur = strtoul10(pCur, &pCur);

  // go to the next line
  PLY::DOM::SkipSpacesAndLineEnd(buffer);

  // now parse all properties of the element
  while (true)
  {
    streamBuffer.getNextLine(buffer);
    pCur = (char*)&buffer[0];

    // skip all comments
    PLY::DOM::SkipComments(buffer);

    PLY::Property prop;
    if (!PLY::Property::ParseProperty(buffer, &prop))
      break;

    pOut->alProperties.push_back(prop);
  }

  return true;
}